

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O3

uint get_memory(uint len,int type,uchar mid)

{
  uint uVar1;
  uint uVar2;
  MemoryNode *pMVar3;
  uint uVar4;
  MemoryNode **ppMVar5;
  MemoryNode *pMVar6;
  MemoryNode **ppMVar7;
  MemoryNode *pMVar8;
  MemoryNode *p;
  MemoryNode *pMVar9;
  
  if (len != 0) {
    if (type == 0) {
      ppMVar7 = &data_free_memory_head;
      ppMVar5 = &data_used_memory_head;
    }
    else {
      if (type != 1) {
        return 0xffffffff;
      }
      ppMVar7 = &code_free_memory_head;
      ppMVar5 = &code_used_memory_head;
    }
    pMVar9 = *ppMVar7;
    if (pMVar9 != (MemoryNode *)0x0) {
      pMVar3 = *ppMVar5;
      do {
        if (len <= pMVar9->size) {
          uVar1 = pMVar9->address;
          pMVar6 = (MemoryNode *)operator_new(0x20);
          uVar2 = pMVar9->address;
          pMVar6->address = uVar2;
          pMVar6->size = len;
          pMVar6->mid = mid;
          do {
            pMVar8 = pMVar3;
            pMVar3 = pMVar8->next;
          } while (pMVar8->next != (MemoryNode *)0x0);
          pMVar8->next = pMVar6;
          pMVar6->forward = pMVar8;
          pMVar6->next = (MemoryNode *)0x0;
          uVar4 = pMVar9->size - len;
          if (uVar4 == 0) {
            pMVar3 = pMVar9->forward;
            pMVar9 = pMVar9->next;
            pMVar3->next = pMVar9;
            pMVar9->forward = pMVar3;
            return uVar1;
          }
          pMVar9->address = uVar2 + len;
          pMVar9->size = uVar4;
          return uVar1;
        }
        pMVar9 = pMVar9->next;
      } while (pMVar9 != (MemoryNode *)0x0);
    }
  }
  return 0xffffffff;
}

Assistant:

EXPORT unsigned get_memory(unsigned len, int type,unsigned char mid) {
	MemoryNode *used_head = nullptr,*free_head = nullptr;
	if (!len) return-1;
	init_get_head(type, free_head, used_head);
	MemoryNode* p = find_memory(len,free_head);
	if (p != nullptr) {
		/*创建新的节点并把节点插入使用的最后*/
		unsigned adr = p->address;
		MemoryNode* new_used = new MemoryNode;
		new_used->address = p->address;
		new_used->size = len;
		new_used->mid = mid;
		MemoryNode* used_node = find_last_node(used_head);
		used_node->next = new_used;
		new_used->forward = used_node;
		new_used->next = nullptr;
		/*空闲块地址加 大小减小*/
		if (p->size == len) { //大小相等则取下节点
			MemoryNode *p_forword = p->forward;
			MemoryNode *p_next = p->next;
			p_forword->next = p_next;
			p_next->forward = p_forword;
		}
		else {
			p->address += len;
			p->size -= len;
		}
		return adr;
	}else return -1;
}